

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void test_summarize(wchar_t failed,wchar_t skips_num)

{
  char *__format;
  char *local_20;
  uint local_14;
  uint i;
  wchar_t skips_num_local;
  wchar_t failed_local;
  
  if (verbosity == L'\xffffffff') {
    __format = ".";
    if (failed != L'\0') {
      __format = "E";
    }
    printf(__format);
    fflush(_stdout);
  }
  else if (verbosity == L'\0') {
    if (failed == L'\0') {
      local_20 = "ok\n";
      if (skips_num != L'\0') {
        local_20 = "skipped\n";
      }
    }
    else {
      local_20 = "FAIL\n";
    }
    printf(local_20);
  }
  log_console = (wchar_t)(verbosity == L'\x01');
  for (local_14 = 0; local_14 < 10000; local_14 = local_14 + 1) {
    if ((1 < failed_lines[local_14].count) && (failed_lines[local_14].skip == 0)) {
      logprintf("%s:%u: Summary: Failed %d times\n",failed_filename,(ulong)local_14,
                (ulong)(uint)failed_lines[local_14].count);
    }
  }
  failed_filename = (char *)0x0;
  memset(failed_lines,0,80000);
  return;
}

Assistant:

static void
test_summarize(int failed, int skips_num)
{
	unsigned int i;

	switch (verbosity) {
	case VERBOSITY_SUMMARY_ONLY:
		printf(failed ? "E" : ".");
		fflush(stdout);
		break;
	case VERBOSITY_PASSFAIL:
		printf(failed ? "FAIL\n" : skips_num ? "skipped\n" : "ok\n");
		break;
	}

	log_console = (verbosity == VERBOSITY_LIGHT_REPORT);

	for (i = 0; i < sizeof(failed_lines)/sizeof(failed_lines[0]); i++) {
		if (failed_lines[i].count > 1 && !failed_lines[i].skip)
			logprintf("%s:%u: Summary: Failed %d times\n",
			    failed_filename, i, failed_lines[i].count);
	}
	/* Clear the failure history for the next file. */
	failed_filename = NULL;
	memset(failed_lines, 0, sizeof(failed_lines));
}